

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManWriteNames(FILE *pFile,char c,int n,Vec_Ptr_t *vNames,int Start,int Skip,
                      Vec_Bit_t *vObjs)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  int d;
  
  d = n;
  if (1 < (uint)n) {
    uVar3 = (ulong)(n - 1);
    d = 0;
    do {
      uVar5 = (uint)uVar3;
      uVar3 = uVar3 / 10;
      d = d + 1;
    } while (9 < uVar5);
  }
  if (0 < n) {
    uVar5 = 0;
    bVar1 = true;
    do {
      if (vObjs == (Vec_Bit_t *)0x0) {
LAB_0021b592:
        Gia_ObjGetDumpName(vNames,c,uVar5,d);
        sVar2 = strlen(Gia_ObjGetDumpName::pBuffer);
        Start = Start + (int)sVar2 + 2;
        if (Start < 0x3d) {
          pcVar4 = "";
          if (!bVar1) {
            pcVar4 = ", ";
          }
        }
        else {
          fwrite(",\n    ",6,1,(FILE *)pFile);
          pcVar4 = "";
          Start = Skip;
        }
        bVar1 = false;
        fprintf((FILE *)pFile,"%s%s",pcVar4,Gia_ObjGetDumpName::pBuffer);
      }
      else {
        if (vObjs->nSize <= (int)uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)vObjs->pArray[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) goto LAB_0021b592;
      }
      uVar5 = uVar5 + 1;
    } while (n != uVar5);
  }
  return;
}

Assistant:

void Gia_ManWriteNames( FILE * pFile, char c, int n, Vec_Ptr_t * vNames, int Start, int Skip, Vec_Bit_t * vObjs )
{
    int Digits = Abc_Base10Log( n );
    int Length = Start, i, fFirst = 1; 
    char * pName;
    for ( i = 0; i < n; i++ )
    {
        if ( vObjs && !Vec_BitEntry(vObjs, i) )
            continue;
        pName = Gia_ObjGetDumpName( vNames, c, i, Digits );
        Length += strlen(pName) + 2;
        if ( Length > 60 )
        {
            fprintf( pFile, ",\n    " );
            Length = Skip;
            fFirst = 1;
        }
        fprintf( pFile, "%s%s", fFirst ? "":", ", pName );
        fFirst = 0;
    }
}